

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O3

SRes ReadTime(CSzBitUi64s *p,UInt32 num,CSzData *sd2,CBuf *tempBufs,UInt32 numTempBufs,
             ISzAlloc *alloc)

{
  Byte BVar1;
  Byte *pBVar2;
  SRes SVar3;
  CNtfsFileTime *pCVar4;
  UInt32 *pUVar5;
  ulong uVar6;
  size_t sVar7;
  UInt32 index;
  uint local_44;
  CSzData *local_40;
  CBuf *local_38;
  
  SVar3 = ReadBitVector(sd2,num,&p->Defs,alloc);
  if (SVar3 == 0) {
    SVar3 = 0x10;
    if (sd2->Size != 0) {
      sVar7 = sd2->Size - 1;
      sd2->Size = sVar7;
      pBVar2 = sd2->Data;
      pUVar5 = (UInt32 *)(pBVar2 + 1);
      sd2->Data = (Byte *)pUVar5;
      BVar1 = *pBVar2;
      local_38 = tempBufs;
      if (BVar1 != '\0') {
        SVar3 = SzReadNumber32(sd2,&local_44);
        if (SVar3 != 0) {
          return SVar3;
        }
        if (numTempBufs <= local_44) {
          return 0x10;
        }
        pUVar5 = (UInt32 *)local_38[local_44].data;
        sVar7 = local_38[local_44].size;
      }
      local_40 = sd2;
      if (num == 0) {
        p->Vals = (CNtfsFileTime *)0x0;
      }
      else {
        pCVar4 = (CNtfsFileTime *)(*alloc->Alloc)(alloc,(ulong)num * 8);
        p->Vals = pCVar4;
        if (pCVar4 == (CNtfsFileTime *)0x0) {
          return 2;
        }
        pBVar2 = p->Defs;
        uVar6 = 0;
        do {
          if ((char)(pBVar2[uVar6 >> 3 & 0x1fffffff] << ((byte)uVar6 & 7)) < '\0') {
            if (sVar7 < 8) {
              return 0x10;
            }
            pCVar4[uVar6].Low = *pUVar5;
            pCVar4[uVar6].High = pUVar5[1];
            sVar7 = sVar7 - 8;
            pUVar5 = pUVar5 + 2;
          }
          else {
            pCVar4[uVar6].Low = 0;
            pCVar4[uVar6].High = 0;
          }
          uVar6 = uVar6 + 1;
        } while (num != uVar6);
      }
      SVar3 = 0;
      if (BVar1 == '\0') {
        local_40->Data = (Byte *)pUVar5;
        local_40->Size = sVar7;
      }
    }
  }
  return SVar3;
}

Assistant:

static MY_NO_INLINE SRes ReadTime(CSzBitUi64s *p, UInt32 num,
    CSzData *sd2,
    const CBuf *tempBufs, UInt32 numTempBufs,
    ISzAlloc *alloc)
{
  CSzData sd;
  UInt32 i;
  CNtfsFileTime *vals;
  Byte *defs;
  Byte external;
  
  RINOK(ReadBitVector(sd2, num, &p->Defs, alloc));
  
  SZ_READ_BYTE_SD(sd2, external);
  if (external == 0)
    sd = *sd2;
  else
  {
    UInt32 index;
    RINOK(SzReadNumber32(sd2, &index));
    if (index >= numTempBufs)
      return SZ_ERROR_ARCHIVE;
    sd.Data = tempBufs[index].data;
    sd.Size = tempBufs[index].size;
  }
  
  MY_ALLOC_ZE(CNtfsFileTime, p->Vals, num, alloc);
  vals = p->Vals;
  defs = p->Defs;
  for (i = 0; i < num; i++)
    if (SzBitArray_Check(defs, i))
    {
      if (sd.Size < 8)
        return SZ_ERROR_ARCHIVE;
      vals[i].Low = GetUi32(sd.Data);
      vals[i].High = GetUi32(sd.Data + 4);
      SKIP_DATA2(sd, 8);
    }
    else
      vals[i].High = vals[i].Low = 0;
  
  if (external == 0)
    *sd2 = sd;
  
  return SZ_OK;
}